

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  TextRecorder *pTVar1;
  TextRecordMemento *m;
  TextRecordMemento *m2;
  string local_80;
  TextRecordMemento *local_60;
  TextRecordMemento *m1;
  string local_50;
  TextRecorder *local_20;
  TextRecorder *recorder;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  recorder = (TextRecorder *)argv;
  argv_local._0_4_ = argc;
  pTVar1 = (TextRecorder *)operator_new(0x28);
  TextRecorder::TextRecorder(pTVar1);
  local_20 = pTVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"sentence 1",(allocator<char> *)((long)&m1 + 7));
  TextRecorder::setText(pTVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&m1 + 7));
  local_60 = TextRecorder::createMemo(local_20);
  TextRecorder::print(local_20);
  pTVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"sentence 2",(allocator<char> *)((long)&m2 + 7));
  TextRecorder::setText(pTVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&m2 + 7));
  m = TextRecorder::createMemo(local_20);
  TextRecorder::print(local_20);
  TextRecorder::loadMemo(local_20,local_60);
  TextRecorder::print(local_20);
  TextRecorder::loadMemo(local_20,m);
  TextRecorder::print(local_20);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	TextRecorder* recorder = new TextRecorder;

	recorder->setText("sentence 1");
	TextRecordMemento* m1 = recorder->createMemo();
	recorder->print();

	recorder->setText("sentence 2");
	TextRecordMemento* m2 = recorder->createMemo();
	recorder->print();

	recorder->loadMemo(m1);
	recorder->print();

	recorder->loadMemo(m2);
	recorder->print();

	return 0;
}